

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_2,_2>::Matrix(Matrix<float,_2,_2> *this,float *src)

{
  int row;
  long lVar1;
  int col;
  long lVar2;
  float fVar3;
  
  Vector<tcu::Vector<float,_2>,_2>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        fVar3 = *src;
      }
      else {
        fVar3 = 0.0;
      }
      *(float *)((long)this + lVar2 * 2 * 4) = fVar3;
    }
    this = (Matrix<float,_2,_2> *)((long)this + 4);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? src : T(0);
}